

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_math.cpp
# Opt level: O2

void __thiscall strain_example4_Test::~strain_example4_Test(strain_example4_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(strain, example4)
{
    precise_unit ustrain(1e-6, eflag);  // microstrain

    addUserDefinedUnit("ustrain", ustrain);
    precise_measurement strain = 45.7 * ustrain;
    EXPECT_EQ(to_string(strain), "45.7 ustrain");

    // applied to a 10 m bar
    auto distortion = strain * (10 * m);
    EXPECT_FLOAT_EQ(distortion.value_as(mm), 0.457F);

    clearUserDefinedUnits();
}